

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12a29d3::DynamicWindowTitler::update_window_title(DynamicWindowTitler *this)

{
  SDL_Window *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  pSVar1 = this->window_;
  if (this->mouse_is_captured_ == false) {
    std::__cxx11::string::string((string *)&local_28,(string *)&this->file_name_);
  }
  else {
    std::operator+(&local_28,&this->file_name_," (press control+escape to release mouse)");
  }
  SDL_SetWindowTitle(pSVar1,local_28._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void update_window_title() {
			SDL_SetWindowTitle(window_, window_title().c_str());
		}